

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O0

void __thiscall
google::protobuf::util::anon_unknown_0::DescriptorPoolTypeResolverTest_TestCustomMessageOptions_Test
::~DescriptorPoolTypeResolverTest_TestCustomMessageOptions_Test
          (DescriptorPoolTypeResolverTest_TestCustomMessageOptions_Test *this)

{
  DescriptorPoolTypeResolverTest_TestCustomMessageOptions_Test *this_local;
  
  ~DescriptorPoolTypeResolverTest_TestCustomMessageOptions_Test(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_F(DescriptorPoolTypeResolverTest, TestCustomMessageOptions) {
  Type type;
  ASSERT_TRUE(
      resolver_
          ->ResolveMessageType(
              GetTypeUrl<proto2_unittest::TestMessageWithCustomOptions>(),
              &type)
          .ok());
  EXPECT_TRUE(
      HasInt32Option(type.options(), "proto2_unittest.message_opt1", -56));
}